

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_vmask_sse4.c
# Opt level: O0

void aom_highbd_blend_a64_vmask_sse4_1
               (uint8_t *dst_8,uint32_t dst_stride,uint8_t *src0_8,uint32_t src0_stride,
               uint8_t *src1_8,uint32_t src1_stride,uint8_t *mask,int w,int h,int bd)

{
  uint32_t in_ECX;
  uint8_t *in_RDX;
  uint32_t in_ESI;
  uint8_t *in_RDI;
  uint8_t *in_R8;
  uint32_t in_R9D;
  uint8_t *in_stack_00000008;
  uint in_stack_00000010;
  uint in_stack_00000018;
  int in_stack_00000020;
  uint16_t *src1;
  uint16_t *src0;
  uint16_t *dst;
  
  if (((in_stack_00000018 | in_stack_00000010) & 3) == 0) {
    (*aom_highbd_blend_a64_vmask_sse4_1::blend[(int)(uint)(in_stack_00000020 == 0xc)]
      [(int)((int)in_stack_00000010 >> 2 & 1)])
              ((uint16_t *)((long)in_RDI << 1),in_ESI,(uint16_t *)((long)in_RDX << 1),in_ECX,
               (uint16_t *)((long)in_R8 << 1),in_R9D,in_stack_00000008,in_stack_00000010,
               in_stack_00000018);
  }
  else {
    aom_highbd_blend_a64_vmask_c
              (in_RDI,in_ESI,in_RDX,in_ECX,in_R8,in_R9D,in_stack_00000008,in_stack_00000010,
               in_stack_00000018,in_stack_00000020);
  }
  return;
}

Assistant:

void aom_highbd_blend_a64_vmask_sse4_1(
    uint8_t *dst_8, uint32_t dst_stride, const uint8_t *src0_8,
    uint32_t src0_stride, const uint8_t *src1_8, uint32_t src1_stride,
    const uint8_t *mask, int w, int h, int bd) {
  typedef void (*blend_fn)(uint16_t * dst, uint32_t dst_stride,
                           const uint16_t *src0, uint32_t src0_stride,
                           const uint16_t *src1, uint32_t src1_stride,
                           const uint8_t *mask, int w, int h);

  // Dimensions are: bd_index X width_index
  static const blend_fn blend[2][2] = {
    {
        // bd == 8 or 10
        blend_a64_vmask_b10_w8n_sse4_1,  // w % 8 == 0
        blend_a64_vmask_b10_w4_sse4_1,   // w == 4
    },
    {
        // bd == 12
        blend_a64_vmask_b12_w8n_sse4_1,  // w % 8 == 0
        blend_a64_vmask_b12_w4_sse4_1,   // w == 4
    }
  };

  assert(IMPLIES(src0_8 == dst_8, src0_stride == dst_stride));
  assert(IMPLIES(src1_8 == dst_8, src1_stride == dst_stride));

  assert(h >= 1);
  assert(w >= 1);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  assert(bd == 8 || bd == 10 || bd == 12);

  if (UNLIKELY((h | w) & 3)) {  // if (w <= 2 || h <= 2)
    aom_highbd_blend_a64_vmask_c(dst_8, dst_stride, src0_8, src0_stride, src1_8,
                                 src1_stride, mask, w, h, bd);
  } else {
    uint16_t *const dst = CONVERT_TO_SHORTPTR(dst_8);
    const uint16_t *const src0 = CONVERT_TO_SHORTPTR(src0_8);
    const uint16_t *const src1 = CONVERT_TO_SHORTPTR(src1_8);

    blend[bd == 12][(w >> 2) & 1](dst, dst_stride, src0, src0_stride, src1,
                                  src1_stride, mask, w, h);
  }
}